

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

double doublerand(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined8 local_38;
  long i;
  long c;
  long b;
  long a;
  double expo;
  double result;
  
  lVar1 = random();
  lVar2 = random();
  uVar3 = random();
  expo = (double)(lVar1 + -0x40000000) * 8388608.0 + (double)(lVar2 >> 8);
  a = 0x4000000000000000;
  for (local_38 = 0x200; (long)local_38 < 0x20001; local_38 = local_38 << 1) {
    if ((uVar3 & local_38) != 0) {
      expo = (double)a * expo;
    }
    a = (long)((double)a * (double)a);
  }
  return expo;
}

Assistant:

double doublerand()
{
  double result;
  double expo;
  long a, b, c;
  long i;

  a = random();
  b = random();
  c = random();
  result = (double) (a - 1073741824) * 8388608.0 + (double) (b >> 8);
  for (i = 512, expo = 2; i <= 131072; i *= 2, expo = expo * expo) {
    if (c & i) {
      result *= expo;
    }
  }
  return result;
}